

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O3

void __thiscall JsonArray_MisplacedComma_Test::TestBody(JsonArray_MisplacedComma_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  AssertHelper AStack_218;
  error_category *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  long local_200;
  undefined1 local_1f8;
  long *local_1f0;
  error_category *local_1e8;
  parser<json_out_callbacks> local_1e0;
  json_out_callbacks local_128;
  json_out_callbacks local_108;
  json_out_callbacks local_e8;
  json_out_callbacks local_c8;
  result_type local_a8;
  result_type local_88;
  result_type local_68;
  result_type local_48;
  
  paVar1 = &local_c8.out_.field_2;
  local_c8.out_.field_2._M_allocated_capacity = 0;
  local_c8.out_.field_2._8_8_ = 0;
  local_c8.out_._M_string_length = 0;
  local_c8.out_._M_dataplus._M_p = (pointer)paVar1;
  pstore::json::parser<json_out_callbacks>::parser(&local_1e0,&local_c8,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.out_._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.out_._M_dataplus._M_p,local_c8.out_.field_2._M_allocated_capacity + 1);
  }
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_200 = CONCAT53(local_200._3_5_,0x2c5b);
  local_210 = (error_category *)&local_200;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_1f0,2);
  local_1e8 = (error_category *)&local_200;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1e0,(span<const_char,__1L> *)&local_1f0);
  if (local_210 != (error_category *)&local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_48,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = pstore::json::get_error_category();
  local_1f0 = (long *)CONCAT44(local_1f0._4_4_,8);
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_210,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",&local_1e0.error_,
             (error_code *)&local_1f0);
  if (local_210._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_208->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x97,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    if (local_1f0 != (long *)0x0) {
      (**(code **)(*local_1f0 + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  paVar1 = &local_1e0.string_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.string_._M_dataplus._M_p,
                    local_1e0.string_.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_1e0.callbacks_.out_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.callbacks_.out_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.callbacks_.out_._M_dataplus._M_p,
                    local_1e0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1e0.stack_.c);
  if (local_1e0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1e0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar3 = &local_e8.out_.field_2;
  local_e8.out_.field_2._M_allocated_capacity = 0;
  local_e8.out_.field_2._8_8_ = 0;
  local_e8.out_._M_string_length = 0;
  local_e8.out_._M_dataplus._M_p = (pointer)paVar3;
  pstore::json::parser<json_out_callbacks>::parser(&local_1e0,&local_e8,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.out_._M_dataplus._M_p != paVar3) {
    operator_delete(local_e8.out_._M_dataplus._M_p,local_e8.out_.field_2._M_allocated_capacity + 1);
  }
  local_200 = CONCAT44(local_200._4_4_,0x312c5b);
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_210 = (error_category *)&local_200;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_1f0,3);
  local_1e8 = (error_category *)&local_200;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1e0,(span<const_char,__1L> *)&local_1f0);
  if (local_210 != (error_category *)&local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_68,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = pstore::json::get_error_category();
  local_1f0 = (long *)CONCAT44(local_1f0._4_4_,8);
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_210,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",&local_1e0.error_,
             (error_code *)&local_1f0);
  if (local_210._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_208->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x9d,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    if (local_1f0 != (long *)0x0) {
      (**(code **)(*local_1f0 + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.string_._M_dataplus._M_p,
                    local_1e0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.callbacks_.out_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.callbacks_.out_._M_dataplus._M_p,
                    local_1e0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1e0.stack_.c);
  if (local_1e0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1e0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar3 = &local_108.out_.field_2;
  local_108.out_.field_2._M_allocated_capacity = 0;
  local_108.out_.field_2._8_8_ = 0;
  local_108.out_._M_string_length = 0;
  local_108.out_._M_dataplus._M_p = (pointer)paVar3;
  pstore::json::parser<json_out_callbacks>::parser(&local_1e0,&local_108,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.out_._M_dataplus._M_p != paVar3) {
    operator_delete(local_108.out_._M_dataplus._M_p,local_108.out_.field_2._M_allocated_capacity + 1
                   );
  }
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000006;
  local_200 = CONCAT17(local_200._7_1_,0x5d322c2c315b);
  local_210 = (error_category *)&local_200;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_1f0,6);
  local_1e8 = (error_category *)&local_200;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1e0,(span<const_char,__1L> *)&local_1f0);
  if (local_210 != (error_category *)&local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_88,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = pstore::json::get_error_category();
  local_1f0 = (long *)CONCAT44(local_1f0._4_4_,8);
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_210,"p.last_error ()",
             "make_error_code (json::error_code::expected_token)",&local_1e0.error_,
             (error_code *)&local_1f0);
  if (local_210._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_208->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xa3,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    if (local_1f0 != (long *)0x0) {
      (**(code **)(*local_1f0 + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.string_._M_dataplus._M_p,
                    local_1e0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.callbacks_.out_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.callbacks_.out_._M_dataplus._M_p,
                    local_1e0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1e0.stack_.c);
  if (local_1e0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1e0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar3 = &local_128.out_.field_2;
  local_128.out_.field_2._M_allocated_capacity = 0;
  local_128.out_.field_2._8_8_ = 0;
  local_128.out_._M_string_length = 0;
  local_128.out_._M_dataplus._M_p = (pointer)paVar3;
  pstore::json::parser<json_out_callbacks>::parser(&local_1e0,&local_128,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.out_._M_dataplus._M_p != paVar3) {
    operator_delete(local_128.out_._M_dataplus._M_p,local_128.out_.field_2._M_allocated_capacity + 1
                   );
  }
  local_200 = 0x5d6575727420315b;
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000008;
  local_1f8 = 0;
  local_210 = (error_category *)&local_200;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_1f0,8);
  local_1e8 = (error_category *)&local_200;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1e0,(span<const_char,__1L> *)&local_1f0);
  if (local_210 != (error_category *)&local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_a8,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = pstore::json::get_error_category();
  local_1f0 = (long *)CONCAT44(local_1f0._4_4_,1);
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_210,"p.last_error ()",
             "make_error_code (json::error_code::expected_array_member)",&local_1e0.error_,
             (error_code *)&local_1f0);
  if (local_210._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_208->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xa9,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    if (local_1f0 != (long *)0x0) {
      (**(code **)(*local_1f0 + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.string_._M_dataplus._M_p,
                    local_1e0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.callbacks_.out_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.callbacks_.out_._M_dataplus._M_p,
                    local_1e0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1e0.stack_.c);
  if ((_Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>)
      local_1e0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (_Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>)0x0) {
    operator_delete((void *)local_1e0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonArray, MisplacedComma) {
    {
        json::parser<json_out_callbacks> p;
        p.input ("[,"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[,1"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[1,,2]"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[1 true]"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_array_member));
    }
}